

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

int glu::TextureTestUtil::computeTextureCompareDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture2DArrayView *src,float *texCoord,
              ReferenceParams *sampleParams,TexComparePrecision *comparePrec,LodPrecision *lodPrec,
              Vec3 *nonShadowThreshold)

{
  Vec3 *pVVar1;
  ReferenceParams *pRVar2;
  bool bVar3;
  long lVar4;
  int z;
  ulong uVar5;
  Vec3 *pVVar6;
  int y;
  Vec3 *pVVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float wy;
  float fVar12;
  float fVar13;
  float width;
  float height;
  Vec2 lodO;
  Vec2 clampedLod;
  Vec2 coordDxo;
  Vec2 lodBounds;
  Vec2 coordDy;
  Vec2 coordDx;
  Vec3 coord;
  Vec4 resPix;
  Vec4 refPix;
  Vec3 triR [2];
  Vec3 triT [2];
  Vec3 triS [2];
  Vec2 lodBias;
  int local_1dc;
  undefined8 local_1c8;
  float local_1bc;
  float local_1b8;
  float local_1b4;
  Vector<float,_2> local_1b0;
  Vec4 local_1a8;
  long local_198;
  Vector<float,_2> local_190;
  PixelBufferAccess *local_188;
  ulong local_180;
  Vector<float,_3> local_178;
  Vector<float,_3> local_168;
  Vector<int,_2> local_158;
  float local_150;
  float local_14c;
  float local_148;
  Vec3 local_144;
  undefined1 local_138 [20];
  float local_124 [2];
  float local_11c;
  Vec3 local_118;
  float local_10c;
  float local_108;
  float local_104;
  Vec3 local_f8;
  float local_ec;
  float local_e8;
  float local_e4;
  Vec3 local_d8;
  float local_cc;
  float local_c8;
  float local_c4;
  Sampler *local_b8;
  Texture2DArrayView *local_b0;
  ReferenceParams *local_a8;
  ConstPixelBufferAccess *local_a0;
  Vec3 *local_98;
  Vec3 *local_90;
  Vec3 *local_88;
  Vector<float,_2> local_80;
  float local_78 [8];
  Vec3 local_58;
  float fStack_4c;
  undefined8 local_48;
  Vector<float,_2> local_38;
  
  local_d8.m_data[0] = *texCoord;
  local_f8.m_data[0] = texCoord[1];
  local_d8.m_data[1] = texCoord[3];
  local_d8.m_data[2] = texCoord[6];
  local_cc = texCoord[9];
  local_f8.m_data[1] = texCoord[4];
  local_f8.m_data[2] = texCoord[7];
  local_ec = texCoord[10];
  local_118.m_data[0] = texCoord[2];
  local_118.m_data[1] = texCoord[5];
  local_118.m_data[2] = texCoord[8];
  local_10c = texCoord[0xb];
  if (src->m_numLevels < 1) {
    local_158.m_data[0] = 0;
    local_158.m_data[1] = 0;
  }
  else {
    local_158.m_data = *(int (*) [2])(src->m_levels->m_size).m_data;
  }
  width = (float)(result->m_size).m_data[0];
  height = (float)(result->m_size).m_data[1];
  local_58.m_data[0] = (sampleParams->super_RenderParams).w.m_data[0];
  local_58.m_data[1] = (sampleParams->super_RenderParams).w.m_data[1];
  local_58.m_data[2] = (sampleParams->super_RenderParams).w.m_data[2];
  fStack_4c = (sampleParams->super_RenderParams).w.m_data[3];
  local_48 = CONCAT44(local_58.m_data[1],local_58.m_data[2]);
  local_80.m_data[0] = 0.0;
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    local_80.m_data[0] = (sampleParams->super_RenderParams).bias;
  }
  local_78[0] = -1.0;
  local_78[1] = 0.0;
  local_78[2] = 1.0;
  local_78[3] = 0.0;
  local_78[4] = 0.0;
  local_78[5] = -1.0;
  local_78[6] = 0.0;
  local_78[7] = 1.0;
  local_138._16_4_ = -1.7146522e+38;
  local_188 = errorMask;
  local_108 = local_118.m_data[2];
  local_104 = local_118.m_data[1];
  local_e8 = local_f8.m_data[2];
  local_e4 = local_f8.m_data[1];
  local_c8 = local_d8.m_data[2];
  local_c4 = local_d8.m_data[1];
  local_a0 = reference;
  local_80.m_data[1] = local_80.m_data[0];
  tcu::RGBA::toVec((RGBA *)(local_138 + 0x10));
  tcu::clear(local_188,(Vec4 *)local_138);
  local_b8 = &sampleParams->sampler;
  local_1dc = 0;
  uVar5 = 0;
  local_b0 = src;
  local_a8 = sampleParams;
  while ((int)uVar5 < (result->m_size).m_data[1]) {
    wy = (float)(int)uVar5 + 0.5;
    local_1bc = wy / height;
    local_14c = height - wy;
    local_150 = 1.0 - local_1bc;
    local_180 = uVar5;
    for (y = 0; z = (int)uVar5, y < (result->m_size).m_data[0]; y = y + 1) {
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_138,(int)result,y,z);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)(local_138 + 0x10),(int)local_a0,y,z);
      local_168.m_data[0] = local_124[0];
      local_168.m_data[1] = local_124[1];
      local_168.m_data[2] = local_11c;
      local_178.m_data[0] = (float)local_138._4_4_;
      local_178.m_data[1] = (float)local_138._8_4_;
      local_178.m_data[2] = (float)local_138._12_4_;
      tcu::operator-((tcu *)&local_144,&local_168,&local_178);
      tcu::abs<float,3>((tcu *)&local_1a8,(Vector<float,_3> *)&local_144);
      tcu::lessThanEqual<float,3>
                ((tcu *)&local_190,(Vector<float,_3> *)&local_1a8,nonShadowThreshold);
      bVar3 = tcu::boolAll<3>((Vector<bool,_3> *)&local_190);
      if (bVar3) {
        if (((float)local_138._0_4_ != (float)local_138._16_4_) ||
           (uVar5 = local_180, NAN((float)local_138._0_4_) || NAN((float)local_138._16_4_))) {
          fVar13 = (float)y + 0.5;
          fVar12 = fVar13 / width;
          bVar3 = 1.0 <= local_1bc + fVar12;
          local_1b8 = wy;
          local_1b4 = fVar13;
          if (bVar3) {
            local_1b8 = local_14c;
            local_1b4 = width - fVar13;
          }
          local_198 = CONCAT44(local_198._4_4_,fVar13);
          fVar13 = local_1bc;
          if (bVar3) {
            fVar12 = 1.0 - fVar12;
            fVar13 = local_150;
          }
          pVVar6 = &local_d8 + bVar3;
          pVVar1 = &local_58 + bVar3;
          fVar10 = projectedTriInterpolate(pVVar6,pVVar1,fVar12,fVar13);
          pVVar7 = &local_f8 + bVar3;
          fVar11 = projectedTriInterpolate(pVVar7,pVVar1,fVar12,fVar13);
          local_144.m_data[2] = projectedTriInterpolate(&local_118 + bVar3,pVVar1,fVar12,fVar13);
          local_144.m_data[0] = fVar10;
          local_144.m_data[1] = fVar11;
          fVar10 = triDerivateX(pVVar6,pVVar1,(float)local_198,width,fVar13);
          local_1a8.m_data[1] = triDerivateX(pVVar7,pVVar1,(float)local_198,width,fVar13);
          local_1a8.m_data[0] = fVar10;
          tcu::Vector<int,_2>::cast<float>(&local_158);
          tcu::operator*((Vector<float,_2> *)&local_1a8,(Vector<float,_2> *)&local_178);
          local_88 = pVVar6;
          fVar13 = triDerivateY(pVVar6,pVVar1,wy,height,fVar12);
          local_98 = pVVar1;
          local_90 = pVVar7;
          local_1a8.m_data[1] = triDerivateY(pVVar7,pVVar1,wy,height,fVar12);
          local_1a8.m_data[0] = fVar13;
          tcu::Vector<int,_2>::cast<float>(&local_158);
          tcu::operator*((Vector<float,_2> *)&local_1a8,&local_190);
          tcu::computeLodBoundsFromDerivates
                    ((tcu *)&local_190,local_168.m_data[0],local_168.m_data[1],local_178.m_data[0],
                     local_178.m_data[1],lodPrec);
          lVar4 = 0;
          while (pVVar6 = local_88, pVVar1 = local_98, lVar4 != 4) {
            local_148 = local_78[lVar4 * 2] + local_1b4;
            fVar13 = local_78[lVar4 * 2 + 1] + local_1b8;
            fVar10 = local_148 / width;
            local_198 = lVar4;
            fVar12 = triDerivateX(local_88,local_98,local_148,width,fVar13 / height);
            pVVar7 = local_90;
            local_1b0.m_data[1] = triDerivateX(local_90,pVVar1,local_148,width,fVar13 / height);
            local_1b0.m_data[0] = fVar12;
            tcu::Vector<int,_2>::cast<float>(&local_158);
            tcu::operator*(&local_1b0,(Vector<float,_2> *)&local_1c8);
            fVar12 = triDerivateY(pVVar6,pVVar1,fVar13,height,fVar10);
            fVar13 = triDerivateY(pVVar7,pVVar1,fVar13,height,fVar10);
            local_1c8 = CONCAT44(fVar13,fVar12);
            tcu::Vector<int,_2>::cast<float>(&local_158);
            tcu::operator*((Vector<float,_2> *)&local_1c8,&local_38);
            tcu::computeLodBoundsFromDerivates
                      ((tcu *)&local_1c8,local_1a8.m_data[0],local_1a8.m_data[1],local_1b0.m_data[0]
                       ,local_1b0.m_data[1],lodPrec);
            fVar12 = (float)((ulong)local_1c8 >> 0x20);
            uVar8 = -(uint)(local_190.m_data[0] <= (float)local_1c8);
            uVar9 = -(uint)(fVar12 <= local_190.m_data[1]);
            local_190.m_data[0] =
                 (float)(~uVar8 & (uint)(float)local_1c8 | (uint)local_190.m_data[0] & uVar8);
            local_190.m_data[1] = (float)(~uVar9 & (uint)fVar12 | (uint)local_190.m_data[1] & uVar9)
            ;
            lVar4 = local_198 + 1;
          }
          tcu::operator+(&local_190,&local_80);
          pRVar2 = local_a8;
          local_1c8._0_4_ = local_a8->minLod;
          local_1c8._4_4_ = local_a8->maxLod;
          tcu::clampLodBounds((tcu *)&local_1b0,(Vec2 *)&local_1a8,(Vec2 *)&local_1c8,lodPrec);
          bVar3 = tcu::isTexCompareResultValid
                            (local_b0,local_b8,comparePrec,&local_144,(Vec2 *)&local_1b0,
                             (pRVar2->super_RenderParams).ref,(float)local_138._0_4_);
          uVar5 = local_180;
          if (!bVar3) {
            local_1c8 = CONCAT44(local_1c8._4_4_,0xff0000ff);
            tcu::RGBA::toVec((RGBA *)&local_1c8);
            tcu::PixelBufferAccess::setPixel(local_188,&local_1a8,y,(int)local_180,0);
            local_1dc = local_1dc + 1;
            uVar5 = local_180;
          }
        }
      }
      else {
        local_144.m_data[0] = -1.7014636e+38;
        tcu::RGBA::toVec((RGBA *)&local_144);
        tcu::PixelBufferAccess::setPixel(local_188,&local_1a8,y,z,0);
        local_1dc = local_1dc + 1;
      }
    }
    uVar5 = (ulong)(z + 1);
  }
  return local_1dc;
}

Assistant:

int computeTextureCompareDiff (const tcu::ConstPixelBufferAccess&	result,
							   const tcu::ConstPixelBufferAccess&	reference,
							   const tcu::PixelBufferAccess&		errorMask,
							   const tcu::Texture2DArrayView&		src,
							   const float*							texCoord,
							   const ReferenceParams&				sampleParams,
							   const tcu::TexComparePrecision&		comparePrec,
							   const tcu::LodPrecision&				lodPrec,
							   const tcu::Vec3&						nonShadowThreshold)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	const tcu::Vec4		sq				= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4		tq				= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4		rq				= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	const tcu::IVec2	dstSize			= tcu::IVec2(result.getWidth(), result.getHeight());
	const float			dstW			= float(dstSize.x());
	const float			dstH			= float(dstSize.y());
	const tcu::IVec2	srcSize			= tcu::IVec2(src.getWidth(), src.getHeight());

	// Coordinates and lod per triangle.
	const tcu::Vec3		triS[2]			= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3		triT[2]			= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3		triR[2]			= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3		triW[2]			= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2		lodBias			((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int					numFailed		= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= result.getPixel(px, py);
			const tcu::Vec4	refPix	= reference.getPixel(px, py);

			// Other channels should trivially match to reference.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(refPix.swizzle(1,2,3) - resPix.swizzle(1,2,3)), nonShadowThreshold)))
			{
				errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
				numFailed += 1;
				continue;
			}

			// Reference result is known to be a valid result, we can
			// skip verification if thes results are equal
			if (resPix.x() != refPix.x())
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const tcu::Vec3	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy));
				const tcu::Vec2	coordDx		= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
														triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy)) * srcSize.asFloat();
				const tcu::Vec2	coordDy		= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
														triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx)) * srcSize.asFloat();

				tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx.x(), coordDx.y(), coordDy.x(), coordDy.y(), lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const tcu::Vec2	coordDxo	= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
															triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo)) * srcSize.asFloat();
					const tcu::Vec2	coordDyo	= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
															triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo)) * srcSize.asFloat();
					const tcu::Vec2	lodO		= tcu::computeLodBoundsFromDerivates(coordDxo.x(), coordDxo.y(), coordDyo.x(), coordDyo.y(), lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isTexCompareResultValid(src, sampleParams.sampler, comparePrec, coord, clampedLod, sampleParams.ref, resPix.x());

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}